

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

void __thiscall
soul::StructuralParser::parseEndpoint
          (StructuralParser *this,ProcessorBase *p,bool isInput,bool alreadyInsideBracedExpression)

{
  bool bVar1;
  uint uVar2;
  EndpointType endpointType_00;
  EndpointType endpointType;
  bool alreadyInsideBracedExpression_local;
  bool isInput_local;
  ProcessorBase *p_local;
  StructuralParser *this_local;
  
  if ((alreadyInsideBracedExpression) ||
     (bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)"{"), !bVar1)) {
    uVar2 = (*(p->super_ModuleBase).super_ASTObject._vptr_ASTObject[5])();
    if ((((uVar2 & 1) == 0) ||
        (bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                 ::matches(&this->super_SOULTokeniser,(TokenType)"$identifier"), !bVar1)) ||
       (bVar1 = isNextTokenEndpointType<soul::StructuralParser>(this), bVar1)) {
      endpointType_00 = parseEndpointType<soul::StructuralParser>(this);
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)"{");
      if (bVar1) {
        while (bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                       ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x54ceac),
              ((bVar1 ^ 0xffU) & 1) != 0) {
          parseEndpoint(this,p,isInput,endpointType_00);
        }
      }
      else {
        parseEndpoint(this,p,isInput,endpointType_00);
      }
    }
    else {
      parseChildEndpoint(this,p,isInput);
    }
  }
  else {
    while (bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                   ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x54ceac),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      parseEndpoint(this,p,isInput,true);
    }
  }
  return;
}

Assistant:

void parseEndpoint (AST::ProcessorBase& p, bool isInput, bool alreadyInsideBracedExpression = false)
    {
        if (! alreadyInsideBracedExpression && matchIf (Operator::openBrace))
        {
            while (! matchIf (Operator::closeBrace))
                parseEndpoint (p, isInput, true);
        }
        else
        {
            if (p.isGraph() && matches (Token::identifier) && ! isNextTokenEndpointType (*this))
                return parseChildEndpoint (p, isInput);

            auto endpointType = parseEndpointType (*this);

            if (matchIf (Operator::openBrace))
            {
                while (! matchIf (Operator::closeBrace))
                    parseEndpoint (p, isInput, endpointType);
            }
            else
            {
                parseEndpoint (p, isInput, endpointType);
            }
        }
    }